

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# record_property_tests.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  UnitTestSource *pUVar4;
  TestResult *pTVar5;
  int ret_2;
  int ret_1;
  int ret;
  Fixed local_1148;
  anon_class_1_0_00000001 local_fb9;
  undefined1 local_fb8 [8];
  AssertionResult iutest_spi_ar_8;
  Fixed local_f60;
  anon_class_1_0_00000001 local_dd1;
  undefined1 local_dd0 [8];
  AssertionResult iutest_spi_ar_7;
  Fixed local_d78;
  anon_class_1_0_00000001 local_be9;
  undefined1 local_be8 [8];
  AssertionResult iutest_spi_ar_6;
  Fixed local_b90;
  anon_class_1_0_00000001 local_a01;
  undefined1 local_a00 [8];
  AssertionResult iutest_spi_ar_5;
  Fixed local_9a8;
  anon_class_1_0_00000001 local_819;
  undefined1 local_818 [8];
  AssertionResult iutest_spi_ar_4;
  Fixed local_7c0;
  anon_class_1_0_00000001 local_631;
  undefined1 local_630 [8];
  AssertionResult iutest_spi_ar_3;
  Fixed local_5d8;
  anon_class_1_0_00000001 local_449;
  undefined1 local_448 [8];
  AssertionResult iutest_spi_ar_2;
  Fixed local_3f0;
  anon_class_1_0_00000001 local_261;
  undefined1 local_260 [8];
  AssertionResult iutest_spi_ar_1;
  Fixed local_208;
  anon_class_1_0_00000001 local_79;
  undefined1 local_78 [8];
  AssertionResult iutest_spi_ar;
  allocator<char> local_39;
  string local_38;
  char **local_18;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  local_18 = argv;
  argv_local._0_4_ = argc;
  iutest::InitIrisUnitTest((int *)&argv_local,argv);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"bar",&local_39);
  iutest::Test::RecordProperty<char[2]>(&local_38,(char (*) [2])0x154414);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  iutest::detail::AlwaysZero();
  main::anon_class_1_0_00000001::operator()((AssertionResult *)local_78,&local_79);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar1) {
    memset(&local_208,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_208);
    pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_78);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_1.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/record_property_tests.cpp"
               ,0x68,pcVar3,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_1.m_result,&local_208);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_1.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_208);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  iutest::detail::AlwaysZero();
  main::anon_class_1_0_00000001::operator()((AssertionResult *)local_260,&local_261);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_260);
  if (!bVar1) {
    memset(&local_3f0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_3f0);
    pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_260);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_2.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/record_property_tests.cpp"
               ,0x69,pcVar3,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_2.m_result,&local_3f0);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_2.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_3f0);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_260);
  iutest::detail::AlwaysZero();
  main::anon_class_1_0_00000001::operator()((AssertionResult *)local_448,&local_449);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_448);
  if (!bVar1) {
    memset(&local_5d8,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_5d8);
    pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_448);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_3.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/record_property_tests.cpp"
               ,0x6a,pcVar3,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_3.m_result,&local_5d8);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_3.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_5d8);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_448);
  iutest::detail::AlwaysZero();
  main::anon_class_1_0_00000001::operator()((AssertionResult *)local_630,&local_631);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_630);
  if (!bVar1) {
    memset(&local_7c0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_7c0);
    pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_630);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_4.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/record_property_tests.cpp"
               ,0x6b,pcVar3,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_4.m_result,&local_7c0);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_4.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_7c0);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_630);
  iutest::detail::AlwaysZero();
  main::anon_class_1_0_00000001::operator()((AssertionResult *)local_818,&local_819);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_818);
  if (!bVar1) {
    memset(&local_9a8,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_9a8);
    pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_818);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_5.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/record_property_tests.cpp"
               ,0x6c,pcVar3,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_5.m_result,&local_9a8);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_5.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_9a8);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_818);
  iutest::detail::AlwaysZero();
  main::anon_class_1_0_00000001::operator()((AssertionResult *)local_a00,&local_a01);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a00);
  if (!bVar1) {
    memset(&local_b90,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_b90);
    pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_a00);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_6.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/record_property_tests.cpp"
               ,0x6d,pcVar3,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_6.m_result,&local_b90);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_6.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_b90);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_a00);
  iutest::detail::AlwaysZero();
  main::anon_class_1_0_00000001::operator()((AssertionResult *)local_be8,&local_be9);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_be8);
  if (!bVar1) {
    memset(&local_d78,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_d78);
    pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_be8);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_7.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/record_property_tests.cpp"
               ,0x6e,pcVar3,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_7.m_result,&local_d78);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_7.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_d78);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_be8);
  iutest::detail::AlwaysZero();
  main::anon_class_1_0_00000001::operator()((AssertionResult *)local_dd0,&local_dd1);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_dd0);
  if (!bVar1) {
    memset(&local_f60,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_f60);
    pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_dd0);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_8.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/record_property_tests.cpp"
               ,0x6f,pcVar3,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_8.m_result,&local_f60);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_8.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_f60);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_dd0);
  iutest::detail::AlwaysZero();
  main::anon_class_1_0_00000001::operator()((AssertionResult *)local_fb8,&local_fb9);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_fb8);
  if (!bVar1) {
    memset(&local_1148,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1148);
    pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_fb8);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&ret_1,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/record_property_tests.cpp"
               ,0x70,pcVar3,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&ret_1,&local_1148);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&ret_1);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1148);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_fb8);
  pUVar4 = iutest::UnitTestSource::GetInstance();
  iVar2 = iutest::UnitTestSource::Run(pUVar4);
  if (iVar2 == 0) {
    pTVar5 = iuutil::GetAdHocTestResult();
    bVar1 = CheckProperty(pTVar5,"bar","C");
    if (bVar1) {
      pUVar4 = iutest::UnitTestSource::GetInstance();
      iVar2 = iutest::UnitTestSource::Run(pUVar4);
      if (iVar2 == 0) {
        pTVar5 = iuutil::GetAdHocTestResult();
        bVar1 = CheckProperty(pTVar5,"bar","C");
        if (bVar1) {
          iutest::InitIrisUnitTest((int *)&argv_local,local_18);
          pUVar4 = iutest::UnitTestSource::GetInstance();
          iVar2 = iutest::UnitTestSource::Run(pUVar4);
          if (iVar2 == 0) {
            pTVar5 = iuutil::GetAdHocTestResult();
            bVar1 = CheckProperty(pTVar5,"bar","C");
            if (bVar1) {
              printf("ad hoc test result is not cleared?\n");
              argv_local._4_4_ = 1;
            }
            else {
              printf("*** Successful ***\n");
              argv_local._4_4_ = 0;
            }
          }
          else {
            argv_local._4_4_ = 1;
          }
        }
        else {
          printf("ad hoc test result is cleared?\n");
          argv_local._4_4_ = 1;
        }
      }
      else {
        argv_local._4_4_ = 1;
      }
    }
    else {
      printf("ad hoc test result is not recorded\n");
      argv_local._4_4_ = 1;
    }
  }
  else {
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char* argv[])
#endif
{
    IUTEST_INIT(&argc, argv);
    ::iutest::Test::RecordProperty("bar", "C");
#if !defined(IUTEST_USE_GTEST)
        // ban list
    IUTEST_EXPECT_NONFATAL_FAILURE( ::iutest::Test::RecordProperty("name"       , "C"), "Reserved key");
    IUTEST_EXPECT_NONFATAL_FAILURE( ::iutest::Test::RecordProperty("tests"      , "C"), "Reserved key");
    IUTEST_EXPECT_NONFATAL_FAILURE( ::iutest::Test::RecordProperty("failures"   , "C"), "Reserved key");
    IUTEST_EXPECT_NONFATAL_FAILURE( ::iutest::Test::RecordProperty("disabled"   , "C"), "Reserved key");
    IUTEST_EXPECT_NONFATAL_FAILURE( ::iutest::Test::RecordProperty("skip"       , "C"), "Reserved key");
    IUTEST_EXPECT_NONFATAL_FAILURE( ::iutest::Test::RecordProperty("errors"     , "C"), "Reserved key");
    IUTEST_EXPECT_NONFATAL_FAILURE( ::iutest::Test::RecordProperty("time"       , "C"), "Reserved key");
    IUTEST_EXPECT_NONFATAL_FAILURE( ::iutest::Test::RecordProperty("timestamp"  , "C"), "Reserved key");
    IUTEST_EXPECT_NONFATAL_FAILURE( ::iutest::Test::RecordProperty("random_seed", "C"), "Reserved key");
#endif

    {
        const int ret = IUTEST_RUN_ALL_TESTS();
        if( ret != 0 ) return 1;
#if !defined(IUTEST_NO_RECORDPROPERTY_OUTSIDE_TESTMETHOD_LIFESPAN)
        if( !CheckProperty(iuutil::GetAdHocTestResult(), "bar", "C") )
        {
            printf("ad hoc test result is not recorded\n");
            return 1;
        }
#endif
    }
#if !defined(IUTEST_NO_RECORDPROPERTY_OUTSIDE_TESTMETHOD_LIFESPAN)
    {
        const int ret = IUTEST_RUN_ALL_TESTS();
        if( ret != 0 ) return 1;
        if( !CheckProperty(iuutil::GetAdHocTestResult(), "bar", "C") )
        {
            printf("ad hoc test result is cleared?\n");
            return 1;
        }
    }
    {
        IUTEST_INIT(&argc, argv);
        const int ret = IUTEST_RUN_ALL_TESTS();
        if( ret != 0 ) return 1;
#if !defined(IUTEST_USE_GTEST)
        if( CheckProperty(iuutil::GetAdHocTestResult(), "bar", "C") )
        {
            printf("ad hoc test result is not cleared?\n");
            return 1;
        }
#else
        if( !CheckProperty(iuutil::GetAdHocTestResult(), "bar", "C") )
        {
            printf("ad hoc test result is cleared? (iutest expect)\n");
            return 1;
        }
#endif
    }
#endif
    printf("*** Successful ***\n");
    return 0;
}